

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O1

sub_channel_info *
idx2::BinarySearch<idx2::sub_channel_info,idx2::sub_channel_info*>
          (sub_channel_info *Beg,sub_channel_info *End,sub_channel_info *Val)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  sub_channel_info *in_RAX;
  sub_channel_info *psVar4;
  
  cVar1 = Val->Level;
  do {
    if (End <= Beg) {
      return End;
    }
    psVar4 = (sub_channel_info *)
             (&Beg->Level +
             (((long)End - (long)Beg >> 4) - ((long)End - (long)Beg >> 0x3f) & 0xfffffffffffffffeU)
             * 8);
    cVar2 = psVar4->Level;
    bVar3 = cVar1 < cVar2;
    if (cVar2 == cVar1) {
      bVar3 = psVar4->Subband < Val->Subband;
    }
    if (bVar3) {
      Beg = psVar4 + 1;
      bVar3 = true;
      psVar4 = End;
    }
    else {
      bVar3 = cVar2 < cVar1;
      if (cVar1 == cVar2) {
        bVar3 = Val->Subband < psVar4->Subband;
      }
      if (!bVar3) {
        in_RAX = psVar4;
        psVar4 = End;
      }
    }
    End = psVar4;
  } while (bVar3);
  return in_RAX;
}

Assistant:

i
BinarySearch(i Beg, i End, const t& Val)
{
  while (Beg < End)
  {
    i Mid = Beg + (End - Beg) / 2;
    if (*Mid < Val)
    {
      Beg = Mid + 1;
      continue;
    }
    else if (Val < *Mid)
    {
      End = Mid;
      continue;
    }
    return Mid;
  }
  return End;
}